

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_resample_filters.cpp
# Opt level: O0

float basisu::B_spline_filter(float t)

{
  float fVar1;
  float tt;
  float t_local;
  undefined4 local_4;
  
  t_local = t;
  if (t < 0.0) {
    t_local = -t;
  }
  if (1.0 <= t_local) {
    if (2.0 <= t_local) {
      local_4 = 0.0;
    }
    else {
      fVar1 = 2.0 - t_local;
      local_4 = fVar1 * fVar1 * fVar1 * 0.16666667;
    }
  }
  else {
    local_4 = (t_local * t_local * 0.5 * t_local - t_local * t_local) + 0.6666667;
  }
  return local_4;
}

Assistant:

static float B_spline_filter(float t) /* box (*) box (*) box (*) box */
	{
		float tt;

		if (t < 0.0f)
			t = -t;

		if (t < 1.0f)
		{
			tt = t * t;
			return ((.5f * tt * t) - tt + (2.0f / 3.0f));
		}
		else if (t < 2.0f)
		{
			t = 2.0f - t;
			return ((1.0f / 6.0f) * (t * t * t));
		}

		return (0.0f);
	}